

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O1

bool read_xpm_header(QIODevice *device,char **source,int *index,QByteArray *state,int *cpp,
                    int *ncols,int *w,int *h)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  bVar4 = false;
  QByteArray::QByteArray(&local_58,200,'\0');
  bVar1 = read_xpm_string(&local_58,device,source,index,state);
  if (bVar1) {
    pcVar3 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    bVar4 = false;
    iVar2 = __isoc99_sscanf(pcVar3,"%d %d %d %d",w,h,ncols,cpp);
    if (3 < iVar2) {
      if (((*w - 0x8000U < 0xffff8001) || (*h - 0x8000U < 0xffff8001)) ||
         (*ncols + 0xfeffffffU < 0xff000000)) {
        bVar4 = false;
      }
      else {
        bVar4 = *cpp - 1U < 0xf;
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool read_xpm_header(
    QIODevice *device, const char * const * source, int& index, QByteArray &state,
    int *cpp, int *ncols, int *w, int *h)
{
    QByteArray buf(200, 0);

    if (!read_xpm_string(buf, device, source, index, state))
        return false;

#ifdef Q_CC_MSVC
        if (sscanf_s(buf, "%d %d %d %d", w, h, ncols, cpp) < 4)
#else
    if (sscanf(buf, "%d %d %d %d", w, h, ncols, cpp) < 4)
#endif
        return false;                                        // < 4 numbers parsed

    if (*w <= 0 || *w > 32767 || *h <= 0 || *h > 32767 || *ncols <= 0 || *ncols > (64 * 64 * 64 * 64) || *cpp <= 0 || *cpp > 15)
        return false;                                        // failed sanity check

    return true;
}